

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseGraph.cpp
# Opt level: O2

void PrintGraph(ParseGraphContext *ctx,SynBase *syntax,char *name)

{
  char *pcVar1;
  long lVar2;
  _func_int **pp_Var3;
  undefined8 uVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  SynBase *pSVar8;
  char *pcVar9;
  char *pcVar10;
  SynBase **ppSVar11;
  InplaceStr *pIVar12;
  
  if (0x400 < ctx->depth) {
    pcVar7 = "{...}";
    goto LAB_001bc1d7;
  }
  if (syntax == (SynBase *)0x0) {
    pcVar7 = "null";
    goto LAB_001bc1d7;
  }
  uVar5 = syntax->typeID;
  switch(uVar5) {
  case 0:
    pcVar7 = "SynError()";
    goto LAB_001bc1d7;
  default:
    if (uVar5 == 0x43) {
      PrintEnterBlock(ctx,name,"SynModule()");
      PrintEnterBlock(ctx,"imports");
      pSVar8 = (SynBase *)syntax[1]._vptr_SynBase;
      while (pSVar8 != (SynBase *)0x0) {
        PrintGraph(ctx,pSVar8,"");
        pSVar8 = pSVar8->next;
        if ((pSVar8 == (SynBase *)0x0) || (pSVar8->typeID != 0x42)) {
          pSVar8 = (SynBase *)0x0;
        }
      }
      PrintLeaveBlock(ctx);
      PrintEnterBlock(ctx,"expressions");
      ppSVar11 = (SynBase **)&syntax[1].begin;
      while (pSVar8 = *ppSVar11, pSVar8 != (SynBase *)0x0) {
        PrintGraph(ctx,pSVar8,"");
        ppSVar11 = &pSVar8->next;
      }
      PrintLeaveBlock(ctx);
      PrintLeaveBlock(ctx);
      OutputContext::Flush(ctx->output);
      return;
    }
    if (uVar5 != 0x42) {
      __assert_fail("!\"unknown type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseGraph.cpp"
                    ,0x34a,"void PrintGraph(ParseGraphContext &, SynBase *, const char *)");
    }
    PrintEnterBlock(ctx,name,"SynModuleImport()");
    pSVar8 = (SynBase *)syntax[1]._vptr_SynBase;
    while (pSVar8 != (SynBase *)0x0) {
      PrintGraph(ctx,pSVar8,"");
      pSVar8 = pSVar8->next;
      if ((pSVar8 == (SynBase *)0x0) || (pSVar8->typeID != 4)) {
        pSVar8 = (SynBase *)0x0;
      }
    }
    goto LAB_001bd3b9;
  case 3:
    pcVar7 = "SynNothing()";
    goto LAB_001bc1d7;
  case 4:
    uVar6 = (ulong)(syntax[1].typeID - (int)syntax[1]._vptr_SynBase);
    pcVar7 = "SynIdentifier(%.*s)";
    goto LAB_001bd37a;
  case 5:
    pcVar7 = "SynTypeAuto()";
    goto LAB_001bc1d7;
  case 6:
    pcVar7 = "SynTypeGeneric()";
    goto LAB_001bc1d7;
  case 7:
    PrintEnterBlock(ctx,name,"SynTypeSimple(%.*s)",
                    (ulong)(uint)(*(int *)&syntax[1].end - (int)syntax[1].begin));
    pSVar8 = (SynBase *)syntax[1]._vptr_SynBase;
    while (pSVar8 != (SynBase *)0x0) {
      PrintGraph(ctx,pSVar8,"");
      pSVar8 = pSVar8->next;
      if ((pSVar8 == (SynBase *)0x0) || (pSVar8->typeID != 4)) {
        pSVar8 = (SynBase *)0x0;
      }
    }
    goto LAB_001bd3b9;
  case 8:
    uVar6 = (ulong)(uint)(*(int *)(syntax[1]._vptr_SynBase + 9) - (int)syntax[1]._vptr_SynBase[8]);
    pcVar7 = "SynTypeAlias(%.*s)";
    goto LAB_001bd37a;
  case 9:
    PrintEnterBlock(ctx,name,"SynTypeArray()");
    PrintGraph(ctx,(SynBase *)syntax[1]._vptr_SynBase,"type");
    PrintEnterBlock(ctx,"sizes");
    ppSVar11 = (SynBase **)&syntax[1].typeID;
    while (pSVar8 = *ppSVar11, pSVar8 != (SynBase *)0x0) {
      PrintGraph(ctx,pSVar8,"");
      ppSVar11 = &pSVar8->next;
    }
    break;
  case 10:
    PrintEnterBlock(ctx,name,"SynTypeReference()");
    goto LAB_001bcd04;
  case 0xb:
    PrintEnterBlock(ctx,name,"SynTypeFunction()");
    PrintGraph(ctx,(SynBase *)syntax[1]._vptr_SynBase,"returnType");
    PrintEnterBlock(ctx,"arguments");
    ppSVar11 = (SynBase **)&syntax[1].typeID;
    while (pSVar8 = *ppSVar11, pSVar8 != (SynBase *)0x0) {
      PrintGraph(ctx,pSVar8,"");
      ppSVar11 = &pSVar8->next;
    }
    break;
  case 0xc:
    PrintEnterBlock(ctx,name,"SynTypeGenericInstance()");
    PrintGraph(ctx,(SynBase *)syntax[1]._vptr_SynBase,"baseType");
    PrintEnterBlock(ctx,"types");
    ppSVar11 = (SynBase **)&syntax[1].typeID;
    while (pSVar8 = *ppSVar11, pSVar8 != (SynBase *)0x0) {
      PrintGraph(ctx,pSVar8,"");
      ppSVar11 = &pSVar8->next;
    }
    break;
  case 0xd:
    pcVar7 = "SynTypeof()";
    goto LAB_001bd399;
  case 0xe:
    pcVar7 = "false";
    if (syntax->field_0x3a != '\0') {
      pcVar7 = "true";
    }
    PrintIndented(ctx,name,"SynBool(%s)",pcVar7);
    return;
  case 0xf:
    uVar6 = (ulong)(syntax[1].typeID - (int)syntax[1]._vptr_SynBase);
    pcVar7 = "SynNumber(%.*s)";
    goto LAB_001bd37a;
  case 0x10:
    pcVar7 = "SynNullptr()";
LAB_001bc1d7:
    PrintIndented(ctx,name,pcVar7);
    return;
  case 0x11:
    uVar6 = (ulong)(syntax[1].typeID - (int)syntax[1]._vptr_SynBase);
    pcVar7 = "SynCharacter(%.*s)";
    goto LAB_001bd37a;
  case 0x12:
    uVar6 = (ulong)(syntax[1].typeID - (int)syntax[1]._vptr_SynBase);
    pcVar7 = "SynString(%.*s)";
    goto LAB_001bd37a;
  case 0x13:
    PrintEnterBlock(ctx,name,"SynArray()");
    for (pSVar8 = syntax + 1; pSVar8 = (SynBase *)pSVar8->_vptr_SynBase, pSVar8 != (SynBase *)0x0;
        pSVar8 = (SynBase *)&pSVar8->next) {
      PrintGraph(ctx,pSVar8,"");
    }
    goto LAB_001bd3b9;
  case 0x14:
    PrintEnterBlock(ctx,name,"SynGenerator()");
    for (pSVar8 = syntax + 1; pSVar8 = (SynBase *)pSVar8->_vptr_SynBase, pSVar8 != (SynBase *)0x0;
        pSVar8 = (SynBase *)&pSVar8->next) {
      PrintGraph(ctx,pSVar8,"");
    }
    goto LAB_001bd3b9;
  case 0x15:
    pcVar7 = "SynAlign()";
    goto LAB_001bd399;
  case 0x16:
    uVar5 = *(int *)(*(long *)&syntax[1].typeID + 0x48) -
            (int)*(undefined8 *)(*(long *)&syntax[1].typeID + 0x40);
    pcVar7 = "SynTypedef(%.*s)";
    goto LAB_001bccf7;
  case 0x17:
    lVar2 = *(long *)&syntax[1].typeID;
    if (lVar2 == 0) {
      pcVar7 = "SynMemberAccess(%%missing%%)";
      goto LAB_001bd399;
    }
    PrintEnterBlock(ctx,name,"SynMemberAccess(%.*s)",
                    (ulong)(uint)(*(int *)(lVar2 + 0x48) - (int)*(undefined8 *)(lVar2 + 0x40)));
    goto LAB_001bd3a6;
  case 0x18:
    pp_Var3 = syntax[1]._vptr_SynBase;
    if (pp_Var3 != (_func_int **)0x0) {
      uVar5 = *(int *)(pp_Var3 + 9) - (int)pp_Var3[8];
      pcVar7 = "SynCallArgument(%.*s)";
      goto LAB_001bc773;
    }
    PrintEnterBlock(ctx,name,"SynCallArgument()");
    goto LAB_001bc780;
  case 0x19:
    PrintEnterBlock(ctx,name,"SynArrayIndex()");
    PrintGraph(ctx,(SynBase *)syntax[1]._vptr_SynBase,"value");
    PrintEnterBlock(ctx,"arguments");
    ppSVar11 = (SynBase **)&syntax[1].typeID;
    while (pSVar8 = *ppSVar11, pSVar8 != (SynBase *)0x0) {
      PrintGraph(ctx,pSVar8,"");
      ppSVar11 = &pSVar8->next;
    }
    break;
  case 0x1a:
    PrintEnterBlock(ctx,name,"SynFunctionCall()");
    PrintGraph(ctx,(SynBase *)syntax[1]._vptr_SynBase,"value");
    PrintEnterBlock(ctx,"aliases");
    ppSVar11 = (SynBase **)&syntax[1].typeID;
    while (pSVar8 = *ppSVar11, pSVar8 != (SynBase *)0x0) {
      PrintGraph(ctx,pSVar8,"");
      ppSVar11 = &pSVar8->next;
    }
    PrintLeaveBlock(ctx);
    PrintEnterBlock(ctx,"arguments");
    ppSVar11 = (SynBase **)&syntax[1].end;
    while (pSVar8 = *ppSVar11, pSVar8 != (SynBase *)0x0) {
      PrintGraph(ctx,pSVar8,"");
      ppSVar11 = &pSVar8->next;
    }
    break;
  case 0x1b:
    pcVar7 = "))--";
    if ((char)syntax[1].typeID != '\0') {
      pcVar7 = "))++";
    }
    pcVar7 = pcVar7 + 2;
    pcVar9 = "SynPreModify(%s)";
    goto LAB_001bcea8;
  case 0x1c:
    pcVar7 = "))--";
    if ((char)syntax[1].typeID != '\0') {
      pcVar7 = "))++";
    }
    pcVar7 = pcVar7 + 2;
    pcVar9 = "SynPostModify(%s)";
    goto LAB_001bcea8;
  case 0x1d:
    pcVar7 = "SynGetAddress()";
    goto LAB_001bd399;
  case 0x1e:
    pcVar7 = "SynDereference()";
    goto LAB_001bd399;
  case 0x1f:
    pcVar7 = "SynSizeof()";
    goto LAB_001bd399;
  case 0x20:
    PrintEnterBlock(ctx,name,"SynNew()");
    PrintGraph(ctx,(SynBase *)syntax[1]._vptr_SynBase,"type");
    PrintEnterBlock(ctx,"arguments");
    ppSVar11 = (SynBase **)&syntax[1].typeID;
    while (pSVar8 = *ppSVar11, pSVar8 != (SynBase *)0x0) {
      PrintGraph(ctx,pSVar8,"");
      ppSVar11 = &pSVar8->next;
    }
    PrintLeaveBlock(ctx);
    PrintGraph(ctx,(SynBase *)syntax[1].end,"count");
    PrintEnterBlock(ctx,"constructor");
    pIVar12 = &syntax[1].pos;
    while (pSVar8 = (SynBase *)pIVar12->begin, pSVar8 != (SynBase *)0x0) {
      PrintGraph(ctx,pSVar8,"");
      pIVar12 = (InplaceStr *)&pSVar8->next;
    }
    break;
  case 0x21:
    pcVar7 = "SynConditional()";
    goto LAB_001bd0c2;
  case 0x22:
    pcVar7 = "SynReturn()";
    goto LAB_001bd399;
  case 0x23:
    pcVar7 = "SynYield()";
LAB_001bd399:
    PrintEnterBlock(ctx,name,pcVar7);
LAB_001bd3a6:
    pSVar8 = (SynBase *)syntax[1]._vptr_SynBase;
LAB_001bd3aa:
    pcVar7 = "value";
    goto LAB_001bd3b1;
  case 0x24:
    pcVar7 = "SynBreak()";
    goto LAB_001bcf18;
  case 0x25:
    pcVar7 = "SynContinue()";
LAB_001bcf18:
    PrintEnterBlock(ctx,name,pcVar7);
    pSVar8 = (SynBase *)syntax[1]._vptr_SynBase;
    pcVar7 = "number";
    goto LAB_001bd3b1;
  case 0x26:
    PrintEnterBlock(ctx,name,"SynBlock()");
    for (pSVar8 = syntax + 1; pSVar8 = (SynBase *)pSVar8->_vptr_SynBase, pSVar8 != (SynBase *)0x0;
        pSVar8 = (SynBase *)&pSVar8->next) {
      PrintGraph(ctx,pSVar8,"");
    }
    goto LAB_001bd3b9;
  case 0x27:
    pcVar7 = "SynIfElse()";
    goto LAB_001bd0c2;
  case 0x28:
    PrintEnterBlock(ctx,name,"SynFor()");
    PrintGraph(ctx,(SynBase *)syntax[1]._vptr_SynBase,"initializer");
    PrintGraph(ctx,*(SynBase **)&syntax[1].typeID,"condition");
    PrintGraph(ctx,(SynBase *)syntax[1].begin,"increment");
    pSVar8 = (SynBase *)syntax[1].end;
    goto LAB_001bc923;
  case 0x29:
    PrintEnterBlock(ctx,name,"SynForEachIterator(%.*s)",
                    (ulong)(uint)(*(int *)(*(long *)&syntax[1].typeID + 0x48) -
                                 (int)*(undefined8 *)(*(long *)&syntax[1].typeID + 0x40)));
    PrintGraph(ctx,(SynBase *)syntax[1]._vptr_SynBase,"type");
    pSVar8 = (SynBase *)syntax[1].begin;
    goto LAB_001bd3aa;
  case 0x2a:
    PrintEnterBlock(ctx,name,"SynForEach()");
    PrintEnterBlock(ctx,"iterators");
    for (pSVar8 = syntax + 1; pSVar8 = (SynBase *)pSVar8->_vptr_SynBase, pSVar8 != (SynBase *)0x0;
        pSVar8 = (SynBase *)&pSVar8->next) {
      PrintGraph(ctx,pSVar8,"");
    }
    PrintLeaveBlock(ctx);
    pSVar8 = (SynBase *)syntax[1].begin;
    goto LAB_001bc923;
  case 0x2b:
    PrintEnterBlock(ctx,name,"SynWhile()");
    PrintGraph(ctx,(SynBase *)syntax[1]._vptr_SynBase,"condition");
    pSVar8 = *(SynBase **)&syntax[1].typeID;
LAB_001bc923:
    pcVar7 = "body";
    goto LAB_001bd3b1;
  case 0x2c:
    PrintEnterBlock(ctx,name,"SynDoWhile()");
    PrintEnterBlock(ctx,"expressions");
    for (pSVar8 = syntax + 1; pSVar8 = (SynBase *)pSVar8->_vptr_SynBase, pSVar8 != (SynBase *)0x0;
        pSVar8 = (SynBase *)&pSVar8->next) {
      PrintGraph(ctx,pSVar8,"");
    }
    PrintLeaveBlock(ctx);
    pSVar8 = (SynBase *)syntax[1].begin;
    pcVar7 = "condition";
    goto LAB_001bd3b1;
  case 0x2d:
    PrintEnterBlock(ctx,name,"SynSwitchCase()");
    PrintGraph(ctx,(SynBase *)syntax[1]._vptr_SynBase,"value");
    PrintEnterBlock(ctx,"expressions");
    ppSVar11 = (SynBase **)&syntax[1].typeID;
    while (pSVar8 = *ppSVar11, pSVar8 != (SynBase *)0x0) {
      PrintGraph(ctx,pSVar8,"");
      ppSVar11 = &pSVar8->next;
    }
    break;
  case 0x2e:
    PrintEnterBlock(ctx,name,"SynSwitch()");
    PrintGraph(ctx,(SynBase *)syntax[1]._vptr_SynBase,"condition");
    PrintEnterBlock(ctx,"cases");
    ppSVar11 = (SynBase **)&syntax[1].typeID;
    while (pSVar8 = *ppSVar11, pSVar8 != (SynBase *)0x0) {
      PrintGraph(ctx,pSVar8,"");
      ppSVar11 = &pSVar8->next;
    }
    break;
  case 0x2f:
    pcVar7 = GetOpName(*(SynUnaryOpType *)&syntax->field_0x3c);
    pcVar9 = "SynUnaryOp(%s)";
LAB_001bcea8:
    PrintEnterBlock(ctx,name,pcVar9,pcVar7);
    goto LAB_001bd3a6;
  case 0x30:
    pcVar7 = GetOpName(*(SynBinaryOpType *)&syntax->field_0x3c);
    pcVar9 = "SynBinaryOp(%s)";
    goto LAB_001bcad7;
  case 0x31:
    PrintEnterBlock(ctx,name,"SynAssignment()");
    goto LAB_001bcf55;
  case 0x32:
    pcVar7 = GetOpName(*(SynModifyAssignType *)&syntax->field_0x3c);
    pcVar9 = "SynModifyAssignment(%s)";
LAB_001bcad7:
    PrintEnterBlock(ctx,name,pcVar9,pcVar7);
LAB_001bcf55:
    PrintGraph(ctx,(SynBase *)syntax[1]._vptr_SynBase,"lhs");
    pSVar8 = *(SynBase **)&syntax[1].typeID;
    pcVar7 = "rhs";
    goto LAB_001bd3b1;
  case 0x33:
    uVar6 = (ulong)(uint)(*(int *)(syntax[1]._vptr_SynBase + 9) - (int)syntax[1]._vptr_SynBase[8]);
    if (*(long *)&syntax[1].typeID == 0) {
      pcVar7 = "SynVariableDefinition(%.*s)";
      goto LAB_001bd37a;
    }
    PrintEnterBlock(ctx,name,"SynVariableDefinition(%.*s)",uVar6);
    pSVar8 = *(SynBase **)&syntax[1].typeID;
    goto LAB_001bcf05;
  case 0x34:
    PrintEnterBlock(ctx,name,"SynVariableDefinitions()");
    PrintGraph(ctx,(SynBase *)syntax[1]._vptr_SynBase,"align");
    PrintGraph(ctx,*(SynBase **)&syntax[1].typeID,"type");
    PrintEnterBlock(ctx,"definitions");
    ppSVar11 = (SynBase **)&syntax[1].begin;
    while (pSVar8 = *ppSVar11, pSVar8 != (SynBase *)0x0) {
      PrintGraph(ctx,pSVar8,"");
      ppSVar11 = &pSVar8->next;
    }
    break;
  case 0x35:
    pcVar7 = syntax[1].pos.begin;
    uVar4 = *(undefined8 *)(*(long *)&syntax[1].typeID + 0x40);
    uVar6 = (ulong)(uint)(*(int *)(*(long *)&syntax[1].typeID + 0x48) - (int)uVar4);
    if (pcVar7 == (char *)0x0) {
      PrintEnterBlock(ctx,name,"SynAccessor(%.*s)",uVar6);
    }
    else {
      PrintEnterBlock(ctx,name,"SynAccessor(%.*s, %.*s)",uVar6,uVar4,
                      (ulong)(uint)(*(int *)(pcVar7 + 0x48) - (int)*(undefined8 *)(pcVar7 + 0x40)),
                      *(undefined8 *)(pcVar7 + 0x40));
    }
    PrintGraph(ctx,(SynBase *)syntax[1].begin,"getBlock");
    pSVar8 = (SynBase *)syntax[1].end;
    pcVar7 = "setBlock";
    goto LAB_001bd3b1;
  case 0x36:
    pcVar7 = "";
    if (syntax->field_0x3a != '\0') {
      pcVar7 = "explicit, ";
    }
    PrintEnterBlock(ctx,name,"SynFunctionArgument(%s%.*s)",pcVar7,
                    (ulong)(uint)(*(int *)(*(long *)&syntax[1].typeID + 0x48) -
                                 (int)*(undefined8 *)(*(long *)&syntax[1].typeID + 0x40)));
    PrintGraph(ctx,(SynBase *)syntax[1]._vptr_SynBase,"type");
    pSVar8 = (SynBase *)syntax[1].begin;
LAB_001bcf05:
    pcVar7 = "initializer";
    goto LAB_001bd3b1;
  case 0x37:
    pcVar7 = "prototype, ";
    if (syntax->field_0x3a == '\0') {
      pcVar7 = "";
    }
    pcVar9 = "coroutine, ";
    if (syntax->field_0x3b == '\0') {
      pcVar9 = "";
    }
    pcVar10 = "accessor, ";
    if ((char)syntax[1].typeID == '\0') {
      pcVar10 = "";
    }
    pcVar1 = syntax[1].pos.begin;
    uVar4 = *(undefined8 *)(pcVar1 + 0x40);
    PrintEnterBlock(ctx,name,"SynFunctionDefinition(%s%s%s%.*s)",pcVar7,pcVar9,pcVar10,
                    (ulong)(uint)(*(int *)(pcVar1 + 0x48) - (int)uVar4),uVar4);
    PrintGraph(ctx,(SynBase *)syntax[1]._vptr_SynBase,"parentType");
    PrintGraph(ctx,(SynBase *)syntax[1].begin,"returnType");
    PrintEnterBlock(ctx,"aliases");
    ppSVar11 = (SynBase **)&syntax[1].pos.end;
    while (pSVar8 = *ppSVar11, pSVar8 != (SynBase *)0x0) {
      PrintGraph(ctx,pSVar8,"");
      ppSVar11 = &pSVar8->next;
    }
    PrintLeaveBlock(ctx);
    PrintEnterBlock(ctx,"arguments");
    ppSVar11 = (SynBase **)&syntax[1].listed;
    while (pSVar8 = *ppSVar11, pSVar8 != (SynBase *)0x0) {
      PrintGraph(ctx,pSVar8,"");
      ppSVar11 = &pSVar8->next;
    }
    PrintLeaveBlock(ctx);
    PrintEnterBlock(ctx,"expressions");
    ppSVar11 = (SynBase **)&syntax[2].typeID;
    while (pSVar8 = *ppSVar11, pSVar8 != (SynBase *)0x0) {
      PrintGraph(ctx,pSVar8,"");
      ppSVar11 = &pSVar8->next;
    }
    break;
  case 0x38:
    uVar5 = *(int *)(*(long *)&syntax[1].typeID + 0x48) -
            (int)*(undefined8 *)(*(long *)&syntax[1].typeID + 0x40);
    pcVar7 = "SynShortFunctionArgument(%.*s)";
LAB_001bccf7:
    PrintEnterBlock(ctx,name,pcVar7,(ulong)uVar5);
LAB_001bcd04:
    pSVar8 = (SynBase *)syntax[1]._vptr_SynBase;
    pcVar7 = "type";
    goto LAB_001bd3b1;
  case 0x39:
    PrintEnterBlock(ctx,name,"SynShortFunctionDefinition()");
    PrintEnterBlock(ctx,"arguments");
    for (pSVar8 = syntax + 1; pSVar8 = (SynBase *)pSVar8->_vptr_SynBase, pSVar8 != (SynBase *)0x0;
        pSVar8 = (SynBase *)&pSVar8->next) {
      PrintGraph(ctx,pSVar8,"");
    }
    PrintLeaveBlock(ctx);
    PrintEnterBlock(ctx,"expressions");
    ppSVar11 = (SynBase **)&syntax[1].begin;
    while (pSVar8 = *ppSVar11, pSVar8 != (SynBase *)0x0) {
      PrintGraph(ctx,pSVar8,"");
      ppSVar11 = &pSVar8->next;
    }
    break;
  case 0x3a:
    uVar5 = *(int *)(syntax[1]._vptr_SynBase + 9) - (int)syntax[1]._vptr_SynBase[8];
    pcVar7 = "SynConstant(%.*s)";
LAB_001bc773:
    PrintEnterBlock(ctx,name,pcVar7,(ulong)uVar5);
LAB_001bc780:
    pSVar8 = *(SynBase **)&syntax[1].typeID;
    goto LAB_001bd3aa;
  case 0x3b:
    PrintEnterBlock(ctx,name,"SynConstantSet()");
    PrintGraph(ctx,(SynBase *)syntax[1]._vptr_SynBase,"type");
    PrintEnterBlock(ctx,"constants");
    ppSVar11 = (SynBase **)&syntax[1].typeID;
    while (pSVar8 = *ppSVar11, pSVar8 != (SynBase *)0x0) {
      PrintGraph(ctx,pSVar8,"");
      ppSVar11 = &pSVar8->next;
    }
    break;
  case 0x3c:
    uVar6 = (ulong)(uint)(*(int *)(syntax[1]._vptr_SynBase + 9) - (int)syntax[1]._vptr_SynBase[8]);
    pcVar7 = "SynClassPrototype(%.*s)";
LAB_001bd37a:
    PrintIndented(ctx,name,pcVar7,uVar6);
    return;
  case 0x3d:
    pcVar7 = "SynClassStaticIf()";
LAB_001bd0c2:
    PrintEnterBlock(ctx,name,pcVar7);
    PrintGraph(ctx,(SynBase *)syntax[1]._vptr_SynBase,"condition");
    PrintGraph(ctx,*(SynBase **)&syntax[1].typeID,"trueBlock");
    pSVar8 = (SynBase *)syntax[1].begin;
    pcVar7 = "falseBlock";
    goto LAB_001bd3b1;
  case 0x3e:
    PrintEnterBlock(ctx,name,"SynClassElements()");
    if (syntax[1]._vptr_SynBase != (_func_int **)0x0) {
      PrintEnterBlock(ctx,"typedefs");
      for (pSVar8 = syntax + 1; pSVar8 = (SynBase *)pSVar8->_vptr_SynBase, pSVar8 != (SynBase *)0x0;
          pSVar8 = (SynBase *)&pSVar8->next) {
        PrintGraph(ctx,pSVar8,"");
      }
      PrintLeaveBlock(ctx);
    }
    if (syntax[1].begin != (Lexeme *)0x0) {
      PrintEnterBlock(ctx,"functions");
      ppSVar11 = (SynBase **)&syntax[1].begin;
      while (pSVar8 = *ppSVar11, pSVar8 != (SynBase *)0x0) {
        PrintGraph(ctx,pSVar8,"");
        ppSVar11 = &pSVar8->next;
      }
      PrintLeaveBlock(ctx);
    }
    if (syntax[1].pos.begin != (char *)0x0) {
      PrintEnterBlock(ctx,"accessors");
      pIVar12 = &syntax[1].pos;
      while (pSVar8 = (SynBase *)pIVar12->begin, pSVar8 != (SynBase *)0x0) {
        PrintGraph(ctx,pSVar8,"");
        pIVar12 = (InplaceStr *)&pSVar8->next;
      }
      PrintLeaveBlock(ctx);
    }
    if (syntax[1].next != (SynBase *)0x0) {
      pSVar8 = syntax + 1;
      PrintEnterBlock(ctx,"members");
      while (pSVar8 = pSVar8->next, pSVar8 != (SynBase *)0x0) {
        PrintGraph(ctx,pSVar8,"");
      }
      PrintLeaveBlock(ctx);
    }
    if (syntax[2]._vptr_SynBase != (_func_int **)0x0) {
      PrintEnterBlock(ctx,"constantSets");
      for (pSVar8 = syntax + 2; pSVar8 = (SynBase *)pSVar8->_vptr_SynBase, pSVar8 != (SynBase *)0x0;
          pSVar8 = (SynBase *)&pSVar8->next) {
        PrintGraph(ctx,pSVar8,"");
      }
      PrintLeaveBlock(ctx);
    }
    if (syntax[2].begin == (Lexeme *)0x0) goto LAB_001bd3b9;
    PrintEnterBlock(ctx,"staticIfs");
    ppSVar11 = (SynBase **)&syntax[2].begin;
    while (pSVar8 = *ppSVar11, pSVar8 != (SynBase *)0x0) {
      PrintGraph(ctx,pSVar8,"");
      ppSVar11 = &pSVar8->next;
    }
    break;
  case 0x3f:
    uVar4 = *(undefined8 *)(*(long *)&syntax[1].typeID + 0x40);
    pcVar7 = ", extendable";
    if (*(char *)&syntax[1].pos.begin == '\0') {
      pcVar7 = "";
    }
    PrintEnterBlock(ctx,name,"SynClassDefinition(%.*s%s)",
                    (ulong)(uint)(*(int *)(*(long *)&syntax[1].typeID + 0x48) - (int)uVar4),uVar4,
                    pcVar7);
    PrintGraph(ctx,(SynBase *)syntax[1]._vptr_SynBase,"align");
    PrintEnterBlock(ctx,"aliases");
    ppSVar11 = (SynBase **)&syntax[1].begin;
    while (pSVar8 = *ppSVar11, pSVar8 != (SynBase *)0x0) {
      PrintGraph(ctx,pSVar8,"");
      ppSVar11 = &pSVar8->next;
    }
    PrintLeaveBlock(ctx);
    PrintGraph(ctx,(SynBase *)syntax[1].pos.end,"baseClass");
    pSVar8 = syntax[1].next;
    pcVar7 = "elements";
LAB_001bd3b1:
    PrintGraph(ctx,pSVar8,pcVar7);
    goto LAB_001bd3b9;
  case 0x40:
    PrintEnterBlock(ctx,name,"SynEnumDefinition(%.*s)",
                    (ulong)(uint)(*(int *)(syntax[1]._vptr_SynBase + 9) -
                                 (int)syntax[1]._vptr_SynBase[8]));
    ppSVar11 = (SynBase **)&syntax[1].typeID;
    while (pSVar8 = *ppSVar11, pSVar8 != (SynBase *)0x0) {
      PrintGraph(ctx,pSVar8,"");
      ppSVar11 = &pSVar8->next;
    }
    goto LAB_001bd3b9;
  case 0x41:
    PrintEnterBlock(ctx,name,"SynNamespaceDefinition()");
    PrintEnterBlock(ctx,"path");
    pSVar8 = (SynBase *)syntax[1]._vptr_SynBase;
    while (pSVar8 != (SynBase *)0x0) {
      PrintGraph(ctx,pSVar8,"");
      pSVar8 = pSVar8->next;
      if ((pSVar8 == (SynBase *)0x0) || (pSVar8->typeID != 4)) {
        pSVar8 = (SynBase *)0x0;
      }
    }
    PrintLeaveBlock(ctx);
    PrintEnterBlock(ctx,"expressions");
    ppSVar11 = (SynBase **)&syntax[1].begin;
    while (pSVar8 = *ppSVar11, pSVar8 != (SynBase *)0x0) {
      PrintGraph(ctx,pSVar8,"");
      ppSVar11 = &pSVar8->next;
    }
  }
  PrintLeaveBlock(ctx);
LAB_001bd3b9:
  PrintLeaveBlock(ctx);
  return;
}

Assistant:

void PrintGraph(ParseGraphContext &ctx, SynBase *syntax, const char *name)
{
	if(ctx.depth > 1024)
	{
		PrintIndented(ctx, name, "{...}");
		return;
	}

	if(isType<SynError>(syntax))
	{
		PrintIndented(ctx, name, "SynError()");
	}
	else if(isType<SynNothing>(syntax))
	{
		PrintIndented(ctx, name, "SynNothing()");
	}
	else if(SynIdentifier *node = getType<SynIdentifier>(syntax))
	{
		PrintIndented(ctx, name, "SynIdentifier(%.*s)", FMT_ISTR(node->name));
	}
	else if(isType<SynTypeAuto>(syntax))
	{
		PrintIndented(ctx, name, "SynTypeAuto()");
	}
	else if(isType<SynTypeGeneric>(syntax))
	{
		PrintIndented(ctx, name, "SynTypeGeneric()");
	}
	else if(SynTypeSimple *node = getType<SynTypeSimple>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynTypeSimple(%.*s)", FMT_ISTR(node->name));

		for(SynIdentifier *part = node->path.head; part; part = getType<SynIdentifier>(part->next))
			PrintGraph(ctx, part, "");

		PrintLeaveBlock(ctx);
	}
	else if(SynTypeAlias *node = getType<SynTypeAlias>(syntax))
	{
		PrintIndented(ctx, name, "SynTypeAlias(%.*s)", FMT_ISTR(node->name->name));
	}
	else if(SynTypeArray *node = getType<SynTypeArray>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynTypeArray()");

		PrintGraph(ctx, node->type, "type");

		PrintEnterBlock(ctx, "sizes");

		for(SynBase *size = node->sizes.head; size; size = size->next)
			PrintGraph(ctx, size, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynTypeReference *node = getType<SynTypeReference>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynTypeReference()");

		PrintGraph(ctx, node->type, "type");

		PrintLeaveBlock(ctx);
	}
	else if(SynTypeFunction *node = getType<SynTypeFunction>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynTypeFunction()");

		PrintGraph(ctx, node->returnType, "returnType");

		PrintEnterBlock(ctx, "arguments");

		for(SynBase *arg = node->arguments.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynTypeGenericInstance *node = getType<SynTypeGenericInstance>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynTypeGenericInstance()");

		PrintGraph(ctx, node->baseType, "baseType");

		PrintEnterBlock(ctx, "types");

		for(SynBase *type = node->types.head; type; type = type->next)
			PrintGraph(ctx, type, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynTypeof *node = getType<SynTypeof>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynTypeof()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynBool *node = getType<SynBool>(syntax))
	{
		PrintIndented(ctx, name, "SynBool(%s)", node->value ? "true" : "false");
	}
	else if(SynNumber *node = getType<SynNumber>(syntax))
	{
		PrintIndented(ctx, name, "SynNumber(%.*s)", FMT_ISTR(node->value));
	}
	else if(isType<SynNullptr>(syntax))
	{
		PrintIndented(ctx, name, "SynNullptr()");
	}
	else if(SynCharacter *node = getType<SynCharacter>(syntax))
	{
		PrintIndented(ctx, name, "SynCharacter(%.*s)", FMT_ISTR(node->value));
	}
	else if(SynString *node = getType<SynString>(syntax))
	{
		PrintIndented(ctx, name, "SynString(%.*s)", FMT_ISTR(node->value));
	}
	else if(SynArray *node = getType<SynArray>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynArray()");

		for(SynBase *value = node->values.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintLeaveBlock(ctx);
	}
	else if(SynGenerator *node = getType<SynGenerator>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynGenerator()");

		for(SynBase *value = node->expressions.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintLeaveBlock(ctx);
	}
	else if(SynAlign *node = getType<SynAlign>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynAlign()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynTypedef *node = getType<SynTypedef>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynTypedef(%.*s)", FMT_ISTR(node->alias->name));

		PrintGraph(ctx, node->type, "type");

		PrintLeaveBlock(ctx);
	}
	else if(SynMemberAccess *node = getType<SynMemberAccess>(syntax))
	{
		if(node->member)
			PrintEnterBlock(ctx, name, "SynMemberAccess(%.*s)", FMT_ISTR(node->member->name));
		else
			PrintEnterBlock(ctx, name, "SynMemberAccess(%%missing%%)");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynCallArgument *node = getType<SynCallArgument>(syntax))
	{
		if(node->name)
			PrintEnterBlock(ctx, name, "SynCallArgument(%.*s)", FMT_ISTR(node->name->name));
		else
			PrintEnterBlock(ctx, name, "SynCallArgument()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynArrayIndex *node = getType<SynArrayIndex>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynArrayIndex()");

		PrintGraph(ctx, node->value, "value");

		PrintEnterBlock(ctx, "arguments");

		for(SynBase *arg = node->arguments.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynFunctionCall *node = getType<SynFunctionCall>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynFunctionCall()");

		PrintGraph(ctx, node->value, "value");

		PrintEnterBlock(ctx, "aliases");

		for(SynBase *arg = node->aliases.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintEnterBlock(ctx, "arguments");

		for(SynBase *arg = node->arguments.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynPreModify *node = getType<SynPreModify>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynPreModify(%s)", node->isIncrement ? "++" : "--");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynPostModify *node = getType<SynPostModify>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynPostModify(%s)", node->isIncrement ? "++" : "--");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynGetAddress *node = getType<SynGetAddress>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynGetAddress()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynDereference *node = getType<SynDereference>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynDereference()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynSizeof *node = getType<SynSizeof>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynSizeof()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynNew *node = getType<SynNew>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynNew()");

		PrintGraph(ctx, node->type, "type");

		PrintEnterBlock(ctx, "arguments");

		for(SynBase *arg = node->arguments.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintGraph(ctx, node->count, "count");

		PrintEnterBlock(ctx, "constructor");

		for(SynBase *arg = node->constructor.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynConditional *node = getType<SynConditional>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynConditional()");

		PrintGraph(ctx, node->condition, "condition");
		PrintGraph(ctx, node->trueBlock, "trueBlock");
		PrintGraph(ctx, node->falseBlock, "falseBlock");

		PrintLeaveBlock(ctx);
	}
	else if(SynReturn *node = getType<SynReturn>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynReturn()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynYield *node = getType<SynYield>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynYield()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynBreak *node = getType<SynBreak>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynBreak()");

		PrintGraph(ctx, node->number, "number");

		PrintLeaveBlock(ctx);
	}
	else if(SynContinue *node = getType<SynContinue>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynContinue()");

		PrintGraph(ctx, node->number, "number");

		PrintLeaveBlock(ctx);
	}
	else if(SynBlock *node = getType<SynBlock>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynBlock()");

		for(SynBase *expr = node->expressions.head; expr; expr = expr->next)
			PrintGraph(ctx, expr, "");

		PrintLeaveBlock(ctx);
	}
	else if(SynIfElse *node = getType<SynIfElse>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynIfElse()");

		PrintGraph(ctx, node->condition, "condition");
		PrintGraph(ctx, node->trueBlock, "trueBlock");
		PrintGraph(ctx, node->falseBlock, "falseBlock");

		PrintLeaveBlock(ctx);
	}
	else if(SynFor *node = getType<SynFor>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynFor()");

		PrintGraph(ctx, node->initializer, "initializer");
		PrintGraph(ctx, node->condition, "condition");
		PrintGraph(ctx, node->increment, "increment");
		PrintGraph(ctx, node->body, "body");

		PrintLeaveBlock(ctx);
	}
	else if(SynForEachIterator *node = getType<SynForEachIterator>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynForEachIterator(%.*s)", FMT_ISTR(node->name->name));

		PrintGraph(ctx, node->type, "type");
		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynForEach *node = getType<SynForEach>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynForEach()");

		PrintEnterBlock(ctx, "iterators");

		for(SynBase *arg = node->iterators.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintGraph(ctx, node->body, "body");

		PrintLeaveBlock(ctx);
	}
	else if(SynWhile *node = getType<SynWhile>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynWhile()");

		PrintGraph(ctx, node->condition, "condition");
		PrintGraph(ctx, node->body, "body");

		PrintLeaveBlock(ctx);
	}
	else if(SynDoWhile *node = getType<SynDoWhile>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynDoWhile()");

		PrintEnterBlock(ctx, "expressions");

		for(SynBase *arg = node->expressions.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintGraph(ctx, node->condition, "condition");

		PrintLeaveBlock(ctx);
	}
	else if(SynSwitchCase *node = getType<SynSwitchCase>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynSwitchCase()");

		PrintGraph(ctx, node->value, "value");

		PrintEnterBlock(ctx, "expressions");

		for(SynBase *arg = node->expressions.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynSwitch *node = getType<SynSwitch>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynSwitch()");

		PrintGraph(ctx, node->condition, "condition");

		PrintEnterBlock(ctx, "cases");

		for(SynBase *arg = node->cases.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynUnaryOp *node = getType<SynUnaryOp>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynUnaryOp(%s)", GetOpName(node->type));

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynBinaryOp *node = getType<SynBinaryOp>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynBinaryOp(%s)", GetOpName(node->type));

		PrintGraph(ctx, node->lhs, "lhs");
		PrintGraph(ctx, node->rhs, "rhs");

		PrintLeaveBlock(ctx);
	}
	else if(SynAssignment *node = getType<SynAssignment>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynAssignment()");

		PrintGraph(ctx, node->lhs, "lhs");
		PrintGraph(ctx, node->rhs, "rhs");

		PrintLeaveBlock(ctx);
	}
	else if(SynModifyAssignment *node = getType<SynModifyAssignment>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynModifyAssignment(%s)", GetOpName(node->type));

		PrintGraph(ctx, node->lhs, "lhs");
		PrintGraph(ctx, node->rhs, "rhs");

		PrintLeaveBlock(ctx);
	}
	else if(SynVariableDefinition *node = getType<SynVariableDefinition>(syntax))
	{
		if(node->initializer)
		{
			PrintEnterBlock(ctx, name, "SynVariableDefinition(%.*s)", FMT_ISTR(node->name->name));

			PrintGraph(ctx, node->initializer, "initializer");

			PrintLeaveBlock(ctx);
		}
		else
		{
			PrintIndented(ctx, name, "SynVariableDefinition(%.*s)", FMT_ISTR(node->name->name));
		}
	}
	else if(SynVariableDefinitions *node = getType<SynVariableDefinitions>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynVariableDefinitions()");

		PrintGraph(ctx, node->align, "align");
		PrintGraph(ctx, node->type, "type");

		PrintEnterBlock(ctx, "definitions");

		for(SynBase *arg = node->definitions.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynAccessor *node = getType<SynAccessor>(syntax))
	{
		if(node->setName)
			PrintEnterBlock(ctx, name, "SynAccessor(%.*s, %.*s)", FMT_ISTR(node->name->name), FMT_ISTR(node->setName->name));
		else
			PrintEnterBlock(ctx, name, "SynAccessor(%.*s)", FMT_ISTR(node->name->name));

		PrintGraph(ctx, node->getBlock, "getBlock");
		PrintGraph(ctx, node->setBlock, "setBlock");

		PrintLeaveBlock(ctx);
	}
	else if(SynFunctionArgument *node = getType<SynFunctionArgument>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynFunctionArgument(%s%.*s)", node->isExplicit ? "explicit, " : "", FMT_ISTR(node->name->name));

		PrintGraph(ctx, node->type, "type");
		PrintGraph(ctx, node->initializer, "initializer");

		PrintLeaveBlock(ctx);
	}
	else if(SynFunctionDefinition *node = getType<SynFunctionDefinition>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynFunctionDefinition(%s%s%s%.*s)", node->prototype ? "prototype, " : "", node->coroutine ? "coroutine, " : "", node->accessor ? "accessor, " : "", FMT_ISTR(node->name->name));

		PrintGraph(ctx, node->parentType, "parentType");
		PrintGraph(ctx, node->returnType, "returnType");

		PrintEnterBlock(ctx, "aliases");

		for(SynBase *arg = node->aliases.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintEnterBlock(ctx, "arguments");

		for(SynBase *arg = node->arguments.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintEnterBlock(ctx, "expressions");

		for(SynBase *arg = node->expressions.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynShortFunctionArgument *node = getType<SynShortFunctionArgument>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynShortFunctionArgument(%.*s)", FMT_ISTR(node->name->name));

		PrintGraph(ctx, node->type, "type");

		PrintLeaveBlock(ctx);
	}
	else if(SynShortFunctionDefinition *node = getType<SynShortFunctionDefinition>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynShortFunctionDefinition()");

		PrintEnterBlock(ctx, "arguments");

		for(SynBase *arg = node->arguments.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintEnterBlock(ctx, "expressions");

		for(SynBase *arg = node->expressions.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynConstant *node = getType<SynConstant>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynConstant(%.*s)", FMT_ISTR(node->name->name));

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynConstantSet *node = getType<SynConstantSet>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynConstantSet()");

		PrintGraph(ctx, node->type, "type");

		PrintEnterBlock(ctx, "constants");

		for(SynBase *arg = node->constants.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynClassPrototype *node = getType<SynClassPrototype>(syntax))
	{
		PrintIndented(ctx, name, "SynClassPrototype(%.*s)", FMT_ISTR(node->name->name));
	}
	else if(SynClassStaticIf *node = getType<SynClassStaticIf>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynClassStaticIf()");

		PrintGraph(ctx, node->condition, "condition");
		PrintGraph(ctx, node->trueBlock, "trueBlock");
		PrintGraph(ctx, node->falseBlock, "falseBlock");

		PrintLeaveBlock(ctx);
	}
	else if(SynClassElements *node = getType<SynClassElements>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynClassElements()");

		if(node->typedefs.head)
		{
			PrintEnterBlock(ctx, "typedefs");

			for(SynBase *arg = node->typedefs.head; arg; arg = arg->next)
				PrintGraph(ctx, arg, "");

			PrintLeaveBlock(ctx);
		}

		if(node->functions.head)
		{
			PrintEnterBlock(ctx, "functions");

			for(SynBase *arg = node->functions.head; arg; arg = arg->next)
				PrintGraph(ctx, arg, "");

			PrintLeaveBlock(ctx);
		}

		if(node->accessors.head)
		{
			PrintEnterBlock(ctx, "accessors");

			for(SynBase *arg = node->accessors.head; arg; arg = arg->next)
				PrintGraph(ctx, arg, "");

			PrintLeaveBlock(ctx);
		}

		if(node->members.head)
		{
			PrintEnterBlock(ctx, "members");

			for(SynBase *arg = node->members.head; arg; arg = arg->next)
				PrintGraph(ctx, arg, "");

			PrintLeaveBlock(ctx);
		}

		if(node->constantSets.head)
		{
			PrintEnterBlock(ctx, "constantSets");

			for(SynBase *arg = node->constantSets.head; arg; arg = arg->next)
				PrintGraph(ctx, arg, "");

			PrintLeaveBlock(ctx);
		}

		if(node->staticIfs.head)
		{
			PrintEnterBlock(ctx, "staticIfs");

			for(SynBase *arg = node->staticIfs.head; arg; arg = arg->next)
				PrintGraph(ctx, arg, "");

			PrintLeaveBlock(ctx);
		}

		PrintLeaveBlock(ctx);
	}
	else if(SynClassDefinition *node = getType<SynClassDefinition>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynClassDefinition(%.*s%s)", FMT_ISTR(node->name->name), node->extendable ? ", extendable" : "");

		PrintGraph(ctx, node->align, "align");

		PrintEnterBlock(ctx, "aliases");

		for(SynBase *arg = node->aliases.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintGraph(ctx, node->baseClass, "baseClass");
		PrintGraph(ctx, node->elements, "elements");

		PrintLeaveBlock(ctx);
	}
	else if(SynEnumDefinition *node = getType<SynEnumDefinition>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynEnumDefinition(%.*s)", FMT_ISTR(node->name->name));

		for(SynBase *arg = node->values.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);
	}
	else if(SynNamespaceDefinition *node = getType<SynNamespaceDefinition>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynNamespaceDefinition()");

		PrintEnterBlock(ctx, "path");

		for(SynIdentifier *part = node->path.head; part; part = getType<SynIdentifier>(part->next))
			PrintGraph(ctx, part, "");

		PrintLeaveBlock(ctx);

		PrintEnterBlock(ctx, "expressions");

		for(SynBase *arg = node->expressions.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynModuleImport *node = getType<SynModuleImport>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynModuleImport()");

		for(SynIdentifier *part = node->path.head; part; part = getType<SynIdentifier>(part->next))
			PrintGraph(ctx, part, "");

		PrintLeaveBlock(ctx);
	}
	else if(SynModule *node = getType<SynModule>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynModule()");

		PrintEnterBlock(ctx, "imports");

		for(SynModuleImport *import = node->imports.head; import; import = getType<SynModuleImport>(import->next))
			PrintGraph(ctx, import, "");

		PrintLeaveBlock(ctx);

		PrintEnterBlock(ctx, "expressions");

		for(SynBase *expr = node->expressions.head; expr; expr = expr->next)
			PrintGraph(ctx, expr, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);

		ctx.output.Flush();
	}
	else if(!syntax)
	{
		PrintIndented(ctx, name, "null");
	}
	else
	{
		assert(!"unknown type");
	}
}